

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

void write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,baryonyx::constraint>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p,constraint *cst,char *separator)

{
  bool bVar1;
  iterator iVar2;
  int *in_R8;
  char *local_28;
  char *separator_local;
  constraint *cst_local;
  raw_problem *p_local;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  
  local_28 = separator;
  separator_local = (char *)cst;
  cst_local = (constraint *)p;
  p_local = (raw_problem *)ctx;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&cst->label);
  if (!bVar1) {
    iVar2 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out
                      ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)p_local
                      );
    fmt::v7::
    format_to<fmt::v7::detail::buffer_appender<char>,char[5],std::basic_string_view<char,std::char_traits<char>>const&,true>
              ((buffer_appender<char>)
               iVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (char (*) [5])"{}: ",
               (basic_string_view<char,_std::char_traits<char>_> *)separator_local);
  }
  write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)p_local,
             (raw_problem *)cst_local,
             (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
             (separator_local + 0x10));
  iVar2 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out
                    ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)p_local);
  fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[6],char_const*&,int_const&,true>
            ((v7 *)iVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             (buffer_appender<char>)0xc8e643,(char (*) [6])&local_28,
             (char **)(separator_local + 0x28),in_R8);
  return;
}

Assistant:

void
write_constraint(FormatContext& ctx,
                 const Problem& p,
                 const Constraint& cst,
                 const char* separator)
{
    if (!cst.label.empty())
        fmt::format_to(ctx.out(), "{}: ", cst.label);

    write_function_element(ctx, p, cst.elements);

    fmt::format_to(ctx.out(), "{}{}\n", separator, cst.value);
}